

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btSoftBody::Link>::copy
          (btAlignedObjectArray<btSoftBody::Link> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long in_RCX;
  int i;
  int local_1c;
  
  for (local_1c = (int)dst; local_1c < (int)src; local_1c = local_1c + 1) {
    memcpy((void *)(in_RCX + (long)local_1c * 0x48),this->m_data + local_1c,0x48);
  }
  return local_1c;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}